

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::assert_shrinking_inodes
          (tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,inode_type_counter_array *expected_shrinking_inode_counts)

{
  char *message;
  undefined1 local_90 [8];
  inode_type_counter_array actual_shrinking_inode_counts;
  long local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  char local_28 [8];
  AssertionResult gtest_ar;
  
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::get_shrinking_inode_counts((inode_type_counter_array *)local_90,&this->test_db);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)
             (actual_shrinking_inode_counts._M_elems + 3),expected_shrinking_inode_counts->_M_elems,
             expected_shrinking_inode_counts[1]._M_elems,(allocator_type *)&local_40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (actual_shrinking_inode_counts._M_elems + 3));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58,&local_40);
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_28,(char *)&local_58,
             (array<unsigned_long,_4UL> *)"(actual_shrinking_inode_counts)");
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (actual_shrinking_inode_counts._M_elems[3] != 0) {
    operator_delete((void *)actual_shrinking_inode_counts._M_elems[3],
                    local_60 - actual_shrinking_inode_counts._M_elems[3]);
  }
  if (local_28[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2d1,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  return;
}

Assistant:

constexpr void assert_shrinking_inodes(
      const inode_type_counter_array &expected_shrinking_inode_counts) {
    const auto actual_shrinking_inode_counts =
        test_db.get_shrinking_inode_counts();
    UNODB_ASSERT_THAT(
        actual_shrinking_inode_counts,
        ::testing::ElementsAreArray(expected_shrinking_inode_counts));
  }